

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::
AddFile<google::protobuf::FileDescriptorProto>
          (DescriptorIndex *this,FileDescriptorProto *file,Value value)

{
  bool bVar1;
  string *psVar2;
  reference pvVar3;
  size_type sVar4;
  LogMessage *pLVar5;
  RepeatedPtrField<google::protobuf::DescriptorProto> *this_00;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *this_01;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *this_02;
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *this_03;
  size_type extraout_RDX;
  StringPiece name;
  bool local_2a9;
  StringPiece local_260;
  reference local_250;
  ServiceDescriptorProto *service;
  const_iterator __end0_3;
  const_iterator __begin0_3;
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *__range2_3;
  StringPiece local_220;
  reference local_210;
  FieldDescriptorProto *extension;
  const_iterator __end0_2;
  const_iterator __begin0_2;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *__range2_2;
  reference local_1e0;
  EnumDescriptorProto *enum_type;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *__range2_1;
  StringPiece local_1b0;
  reference local_1a0;
  DescriptorProto *message_type;
  const_iterator __end0;
  const_iterator __begin0;
  RepeatedPtrField<google::protobuf::DescriptorProto> *__range2;
  LogMessage local_178;
  DescriptorIndex *local_140;
  __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>_>
  local_138;
  __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>_>
  local_130;
  StringPiece local_128;
  value_type local_118;
  StringPiece local_f0;
  String local_e0;
  LogFinisher local_b9;
  LogMessage local_b8;
  StringPiece local_80 [2];
  value_type local_60;
  FileDescriptorProto *local_30;
  FileDescriptorProto *file_local;
  DescriptorIndex *this_local;
  Value value_local;
  
  local_60.data = value.first;
  local_60.size = value.second;
  local_30 = file;
  file_local = (FileDescriptorProto *)this;
  this_local = (DescriptorIndex *)local_60.data;
  value_local.first._0_4_ = local_60.size;
  std::__cxx11::string::string((string *)&local_60.encoded_package);
  std::
  vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
  ::push_back(&this->all_values_,&local_60);
  EncodedEntry::~EncodedEntry(&local_60);
  psVar2 = FileDescriptorProto::package_abi_cxx11_(local_30);
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(local_80,psVar2);
  name.length_ = extraout_RDX;
  name.ptr_ = (char *)local_80[0].length_;
  bVar1 = anon_unknown_31::ValidateSymbolName((anon_unknown_31 *)local_80[0].ptr_,name);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    psVar2 = FileDescriptorProto::package_abi_cxx11_(local_30);
    stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_f0,psVar2);
    EncodeString_abi_cxx11_(&local_e0,this,local_f0);
    pvVar3 = std::
             vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
             ::back(&this->all_values_);
    std::__cxx11::string::operator=((string *)&pvVar3->encoded_package,(string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    sVar4 = std::
            vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
            ::size(&this->all_values_);
    local_118.data_offset = (int)sVar4 + -1;
    psVar2 = FileDescriptorProto::name_abi_cxx11_(local_30);
    stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_128,psVar2);
    EncodeString_abi_cxx11_(&local_118.encoded_name,this,local_128);
    bVar1 = InsertIfNotPresent<std::set<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>>>
                      (&this->by_name_,&local_118);
    local_2a9 = true;
    if (bVar1) {
      local_130._M_current =
           (FileEntry *)
           std::
           vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
           ::begin(&this->by_name_flat_);
      local_138._M_current =
           (FileEntry *)
           std::
           vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
           ::end(&this->by_name_flat_);
      psVar2 = FileDescriptorProto::name_abi_cxx11_(local_30);
      local_140 = (DescriptorIndex *)
                  std::
                  set<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
                  ::key_comp(&this->by_name_);
      local_2a9 = std::
                  binary_search<__gnu_cxx::__normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry*,std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>>>,std::__cxx11::string,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare>
                            (local_130,local_138,psVar2,(FileCompare)local_140);
    }
    FileEntry::~FileEntry(&local_118);
    if (local_2a9 == false) {
      this_00 = FileDescriptorProto::message_type(local_30);
      __end0 = RepeatedPtrField<google::protobuf::DescriptorProto>::begin(this_00);
      message_type = (DescriptorProto *)
                     RepeatedPtrField<google::protobuf::DescriptorProto>::end(this_00);
      while (bVar1 = internal::RepeatedPtrIterator<const_google::protobuf::DescriptorProto>::
                     operator!=(&__end0,(iterator *)&message_type), bVar1) {
        local_1a0 = internal::RepeatedPtrIterator<const_google::protobuf::DescriptorProto>::
                    operator*(&__end0);
        psVar2 = DescriptorProto::name_abi_cxx11_(local_1a0);
        stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_1b0,psVar2);
        bVar1 = AddSymbol(this,local_1b0);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          return false;
        }
        psVar2 = FileDescriptorProto::name_abi_cxx11_(local_30);
        stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
                  ((StringPiece *)&__range2_1,psVar2);
        bVar1 = AddNestedExtensions<google::protobuf::DescriptorProto>(this,___range2_1,local_1a0);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          return false;
        }
        internal::RepeatedPtrIterator<const_google::protobuf::DescriptorProto>::operator++(&__end0);
      }
      this_01 = FileDescriptorProto::enum_type(local_30);
      __end0_1 = RepeatedPtrField<google::protobuf::EnumDescriptorProto>::begin(this_01);
      enum_type = (EnumDescriptorProto *)
                  RepeatedPtrField<google::protobuf::EnumDescriptorProto>::end(this_01);
      while (bVar1 = internal::RepeatedPtrIterator<const_google::protobuf::EnumDescriptorProto>::
                     operator!=(&__end0_1,(iterator *)&enum_type), bVar1) {
        local_1e0 = internal::RepeatedPtrIterator<const_google::protobuf::EnumDescriptorProto>::
                    operator*(&__end0_1);
        psVar2 = EnumDescriptorProto::name_abi_cxx11_(local_1e0);
        stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
                  ((StringPiece *)&__range2_2,psVar2);
        bVar1 = AddSymbol(this,___range2_2);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          return false;
        }
        internal::RepeatedPtrIterator<const_google::protobuf::EnumDescriptorProto>::operator++
                  (&__end0_1);
      }
      this_02 = FileDescriptorProto::extension(local_30);
      __end0_2 = RepeatedPtrField<google::protobuf::FieldDescriptorProto>::begin(this_02);
      extension = (FieldDescriptorProto *)
                  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::end(this_02);
      while (bVar1 = internal::RepeatedPtrIterator<const_google::protobuf::FieldDescriptorProto>::
                     operator!=(&__end0_2,(iterator *)&extension), bVar1) {
        local_210 = internal::RepeatedPtrIterator<const_google::protobuf::FieldDescriptorProto>::
                    operator*(&__end0_2);
        psVar2 = FieldDescriptorProto::name_abi_cxx11_(local_210);
        stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_220,psVar2);
        bVar1 = AddSymbol(this,local_220);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          return false;
        }
        psVar2 = FileDescriptorProto::name_abi_cxx11_(local_30);
        stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
                  ((StringPiece *)&__range2_3,psVar2);
        bVar1 = AddExtension<google::protobuf::FieldDescriptorProto>(this,___range2_3,local_210);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          return false;
        }
        internal::RepeatedPtrIterator<const_google::protobuf::FieldDescriptorProto>::operator++
                  (&__end0_2);
      }
      this_03 = FileDescriptorProto::service(local_30);
      __end0_3 = RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::begin(this_03);
      service = (ServiceDescriptorProto *)
                RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::end(this_03);
      while (bVar1 = internal::RepeatedPtrIterator<const_google::protobuf::ServiceDescriptorProto>::
                     operator!=(&__end0_3,(iterator *)&service), bVar1) {
        local_250 = internal::RepeatedPtrIterator<const_google::protobuf::ServiceDescriptorProto>::
                    operator*(&__end0_3);
        psVar2 = ServiceDescriptorProto::name_abi_cxx11_(local_250);
        stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_260,psVar2);
        bVar1 = AddSymbol(this,local_260);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          return false;
        }
        internal::RepeatedPtrIterator<const_google::protobuf::ServiceDescriptorProto>::operator++
                  (&__end0_3);
      }
      value_local._15_1_ = 1;
    }
    else {
      internal::LogMessage::LogMessage
                (&local_178,LOGLEVEL_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
                 ,0x281);
      pLVar5 = internal::LogMessage::operator<<(&local_178,"File already exists in database: ");
      psVar2 = FileDescriptorProto::name_abi_cxx11_(local_30);
      pLVar5 = internal::LogMessage::operator<<(pLVar5,psVar2);
      internal::LogFinisher::operator=((LogFinisher *)((long)&__range2 + 7),pLVar5);
      internal::LogMessage::~LogMessage(&local_178);
      value_local._15_1_ = 0;
    }
  }
  else {
    internal::LogMessage::LogMessage
              (&local_b8,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
               ,0x277);
    pLVar5 = internal::LogMessage::operator<<(&local_b8,"Invalid package name: ");
    psVar2 = FileDescriptorProto::package_abi_cxx11_(local_30);
    pLVar5 = internal::LogMessage::operator<<(pLVar5,psVar2);
    internal::LogFinisher::operator=(&local_b9,pLVar5);
    internal::LogMessage::~LogMessage(&local_b8);
    value_local._15_1_ = 0;
  }
  return (bool)value_local._15_1_;
}

Assistant:

bool EncodedDescriptorDatabase::DescriptorIndex::AddFile(const FileProto& file,
                                                         Value value) {
  // We push `value` into the array first. This is important because the AddXXX
  // functions below will expect it to be there.
  all_values_.push_back({value.first, value.second, {}});

  if (!ValidateSymbolName(file.package())) {
    GOOGLE_LOG(ERROR) << "Invalid package name: " << file.package();
    return false;
  }
  all_values_.back().encoded_package = EncodeString(file.package());

  if (!InsertIfNotPresent(
          &by_name_, FileEntry{static_cast<int>(all_values_.size() - 1),
                               EncodeString(file.name())}) ||
      std::binary_search(by_name_flat_.begin(), by_name_flat_.end(),
                         file.name(), by_name_.key_comp())) {
    GOOGLE_LOG(ERROR) << "File already exists in database: " << file.name();
    return false;
  }

  for (const auto& message_type : file.message_type()) {
    if (!AddSymbol(message_type.name())) return false;
    if (!AddNestedExtensions(file.name(), message_type)) return false;
  }
  for (const auto& enum_type : file.enum_type()) {
    if (!AddSymbol(enum_type.name())) return false;
  }
  for (const auto& extension : file.extension()) {
    if (!AddSymbol(extension.name())) return false;
    if (!AddExtension(file.name(), extension)) return false;
  }
  for (const auto& service : file.service()) {
    if (!AddSymbol(service.name())) return false;
  }

  return true;
}